

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nwkTiming.c
# Opt level: O3

float Nwk_NodeComputeArrival(Nwk_Obj_t *pObj,int fUseSorting)

{
  float (*pafVar1) [33];
  If_LibLut_t *pIVar2;
  uint uVar3;
  int iVar4;
  long lVar5;
  long lVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  int pPinPerm [32];
  float pPinDelays [32];
  int local_118 [32];
  float local_98 [34];
  
  uVar3 = *(uint *)&pObj->field_0x20 & 7;
  if (uVar3 == 1) {
    fVar9 = pObj->tArrival;
  }
  else if (uVar3 == 2) {
    fVar9 = (*pObj->pFanio)->tArrival;
  }
  else {
    if (uVar3 != 3) {
      __assert_fail("Nwk_ObjIsNode(pObj) || Nwk_ObjIsCi(pObj) || Nwk_ObjIsCo(pObj)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/nwk/nwkTiming.c"
                    ,0x8b,"float Nwk_NodeComputeArrival(Nwk_Obj_t *, int)");
    }
    pIVar2 = pObj->pMan->pLutLib;
    if (pIVar2 == (If_LibLut_t *)0x0) {
      iVar4 = pObj->nFanins;
      if (0 < (long)iVar4) {
        lVar5 = 0;
        fVar9 = -1e+09;
        do {
          if (pObj->pFanio[lVar5] == (Nwk_Obj_t *)0x0) {
            return fVar9;
          }
          fVar7 = pObj->pFanio[lVar5]->tArrival;
          fVar8 = fVar7 + 1.0;
          if (fVar7 + 1.0 <= fVar9) {
            fVar8 = fVar9;
          }
          lVar5 = lVar5 + 1;
          fVar9 = fVar8;
        } while (iVar4 != lVar5);
        return fVar8;
      }
    }
    else {
      iVar4 = pObj->nFanins;
      lVar5 = (long)iVar4;
      pafVar1 = pIVar2->pLutDelays + lVar5;
      if (pIVar2->fVarPinDelays == 0) {
        if (0 < iVar4) {
          lVar6 = 0;
          fVar9 = -1e+09;
          do {
            if (pObj->pFanio[lVar6] == (Nwk_Obj_t *)0x0) {
              return fVar9;
            }
            fVar7 = pObj->pFanio[lVar6]->tArrival + (*pafVar1)[0];
            if (fVar7 <= fVar9) {
              fVar7 = fVar9;
            }
            lVar6 = lVar6 + 1;
            fVar9 = fVar7;
          } while (lVar5 != lVar6);
          return fVar7;
        }
      }
      else if (fUseSorting == 0) {
        if (0 < iVar4) {
          lVar6 = 0;
          fVar9 = -1e+09;
          do {
            if (pObj->pFanio[lVar6] == (Nwk_Obj_t *)0x0) {
              return fVar9;
            }
            fVar7 = pObj->pFanio[lVar6]->tArrival + (*pafVar1)[lVar6];
            if (fVar7 <= fVar9) {
              fVar7 = fVar9;
            }
            lVar6 = lVar6 + 1;
            fVar9 = fVar7;
          } while (lVar5 != lVar6);
          return fVar7;
        }
      }
      else {
        Nwk_ManDelayTraceSortPins(pObj,local_118,local_98);
        iVar4 = pObj->nFanins;
        if (0 < (long)iVar4) {
          lVar5 = 0;
          fVar9 = -1e+09;
          do {
            if (pObj->pFanio[lVar5] == (Nwk_Obj_t *)0x0) {
              return fVar9;
            }
            fVar7 = pObj->pFanio[local_118[lVar5]]->tArrival + (*pafVar1)[lVar5];
            if (fVar7 <= fVar9) {
              fVar7 = fVar9;
            }
            lVar5 = lVar5 + 1;
            fVar9 = fVar7;
          } while (iVar4 != lVar5);
          return fVar7;
        }
      }
    }
    if (iVar4 == 0) {
      fVar9 = 0.0;
    }
    else {
      fVar9 = -1e+09;
    }
  }
  return fVar9;
}

Assistant:

float Nwk_NodeComputeArrival( Nwk_Obj_t * pObj, int fUseSorting )
{
    If_LibLut_t * pLutLib = pObj->pMan->pLutLib;
    int pPinPerm[32];
    float pPinDelays[32];
    Nwk_Obj_t * pFanin;
    float tArrival, * pDelays;
    int k;
    assert( Nwk_ObjIsNode(pObj) || Nwk_ObjIsCi(pObj) || Nwk_ObjIsCo(pObj) );
    if ( Nwk_ObjIsCi(pObj) )
        return Nwk_ObjArrival(pObj);
    if ( Nwk_ObjIsCo(pObj) )
        return Nwk_ObjArrival( Nwk_ObjFanin0(pObj) );
    tArrival = -TIM_ETERNITY;
    if ( pLutLib == NULL )
    {
        Nwk_ObjForEachFanin( pObj, pFanin, k )
            if ( tArrival < Nwk_ObjArrival(pFanin) + 1.0 )
                tArrival = Nwk_ObjArrival(pFanin) + 1.0;
    }
    else if ( !pLutLib->fVarPinDelays )
    {
        pDelays = pLutLib->pLutDelays[Nwk_ObjFaninNum(pObj)];
        Nwk_ObjForEachFanin( pObj, pFanin, k )
            if ( tArrival < Nwk_ObjArrival(pFanin) + pDelays[0] )
                tArrival = Nwk_ObjArrival(pFanin) + pDelays[0];
    }
    else
    {
        pDelays = pLutLib->pLutDelays[Nwk_ObjFaninNum(pObj)];
        if ( fUseSorting )
        {
            Nwk_ManDelayTraceSortPins( pObj, pPinPerm, pPinDelays );
            Nwk_ObjForEachFanin( pObj, pFanin, k ) 
                if ( tArrival < Nwk_ObjArrival(Nwk_ObjFanin(pObj,pPinPerm[k])) + pDelays[k] )
                    tArrival = Nwk_ObjArrival(Nwk_ObjFanin(pObj,pPinPerm[k])) + pDelays[k];
        }
        else
        {
            Nwk_ObjForEachFanin( pObj, pFanin, k )
                if ( tArrival < Nwk_ObjArrival(pFanin) + pDelays[k] )
                    tArrival = Nwk_ObjArrival(pFanin) + pDelays[k];
        }
    }
    if ( Nwk_ObjFaninNum(pObj) == 0 )
        tArrival = 0.0;
    return tArrival;
}